

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

bool __thiscall ConfusableMatcher::MatchWordBoundaryToRight(ConfusableMatcher *this,CMStringView In)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  int local_2c;
  int res;
  int x;
  ConfusableMatcher *this_local;
  CMStringView In_local;
  
  In_local._M_len = (size_t)In._M_str;
  this_local = (ConfusableMatcher *)In._M_len;
  sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (4 < sVar2) {
    __assert_fail("In.size() < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0x159,"bool ConfusableMatcher::MatchWordBoundaryToRight(CMStringView)");
  }
  sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar2 == 0) {
    In_local._M_str._7_1_ = false;
  }
  else {
    sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
            size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_2c = (int)sVar2;
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) {
        return false;
      }
      pcVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      iVar1 = MatchWordBoundary(this,(uchar *)(pcVar3 + local_2c),(int)sVar2 - local_2c);
    } while (iVar1 != 1);
    In_local._M_str._7_1_ = true;
  }
  return In_local._M_str._7_1_;
}

Assistant:

bool ConfusableMatcher::MatchWordBoundaryToRight(CMStringView In)
{
	/*
	 * When searching from left to right, it needs to check everything at most four times as it, for example,
	 * can decode 3 char length codepoint without a match and then find a match at fourth position
	 * 
	 * aaabMATCH
	 *    ^ word boundary
	 * ^^^ decodable char
	 */
	assert(In.size() < 5);
	
	if (In.size() == 0)
		return false;

	/*
	 * Look for chars that were decoded exactly to In.size() - x, we want to avoid scenarios where
	 * char is decodable and is a word boundary char, but does not touch the match.
	 * 
	 * Start looking at characters nearest to the match because... it seems right that way
	 */
	for (int x = In.size() - 1;x >= 0;x--) {
		int res = MatchWordBoundary((const unsigned char*)In.data() + x, In.size() - x);
		if (res == 1)
			return true;
	}

	return false;

}